

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

lword entry_address(GlobalVars *gv)

{
  int iVar1;
  node *in_RAX;
  Symbol *pSVar2;
  ushort **ppuVar3;
  node *pnVar4;
  node *pnVar5;
  node **ppnVar6;
  bool bVar7;
  lword entry;
  node *local_18;
  
  local_18 = in_RAX;
  if (gv->entry_name != (char *)0x0) {
    local_18 = (node *)0x0;
    pSVar2 = findsymbol(gv,(Section *)0x0,gv->entry_name);
    if (pSVar2 == (Symbol *)0x0) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)&((node *)*ppuVar3)->next + (ulong)(byte)*gv->entry_name * 2 + 1) & 8) ==
          0) {
        bVar7 = true;
        pnVar4 = (node *)*ppuVar3;
      }
      else {
        iVar1 = __isoc99_sscanf(gv->entry_name,"%lli",&local_18);
        bVar7 = iVar1 != 1;
        pnVar4 = local_18;
      }
    }
    else {
      bVar7 = false;
      pnVar4 = (node *)pSVar2->value;
    }
    if (!bVar7) {
      return (lword)pnVar4;
    }
  }
  pSVar2 = findsymbol(gv,(Section *)0x0,"_start");
  if (pSVar2 == (Symbol *)0x0) {
    pnVar4 = (gv->lnksec).first;
    do {
      pnVar5 = pnVar4;
      if (pnVar5->next == (node *)0x0) {
        pnVar5 = (node *)0x0;
        break;
      }
      pnVar4 = pnVar5->next;
    } while (((~*(byte *)((long)&pnVar5[2].next + 2) & 5) != 0 ||
             ((ulong)pnVar5[2].next & 0x300) != 0x100) || *(char *)&pnVar5[2].next != '\x01');
    if (pnVar5 == (node *)0x0) {
      return 0;
    }
    ppnVar6 = &pnVar5[4].pred;
  }
  else {
    ppnVar6 = (node **)&pSVar2->value;
  }
  return (lword)*ppnVar6;
}

Assistant:

lword entry_address(struct GlobalVars *gv)
/* returns address of entry point for executables */
{
  struct Symbol *sym;
  struct LinkedSection *ls;

  if (gv->entry_name) {
    lword entry = 0;

    if (sym = findsymbol(gv,NULL,gv->entry_name)) {
      return (lword)sym->value;
    }
    else if (isdigit((unsigned char)*gv->entry_name)) {
      if (sscanf(gv->entry_name,"%lli",&entry) == 1)
        return entry;
    }
  }

  /* plan b: search for _start symbol: */
  if (sym = findsymbol(gv,NULL,"_start"))
      return (lword)sym->value;

  /* plan c: search for first executable section */
  if (ls = find_lnksec(gv,NULL,ST_CODE,SF_ALLOC,SF_ALLOC|SF_UNINITIALIZED,
                       SP_READ|SP_EXEC))
    return (lword)ls->base;

  return 0;
}